

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O1

Gia_Man_t * Abc_NtkDeriveFlatGia(Abc_Ntk_t *pNtk)

{
  char *pcVar1;
  long *plVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *p;
  size_t sVar5;
  char *pcVar6;
  Vec_Ptr_t *pVVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  long lVar10;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                  ,0x109,"Gia_Man_t *Abc_NtkDeriveFlatGia(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("!Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                  ,0x10a,"Gia_Man_t *Abc_NtkDeriveFlatGia(Abc_Ntk_t *)");
  }
  Abc_NtkFillTemp(pNtk);
  p = Gia_ManStart(0x10000);
  pcVar1 = pNtk->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p->pName = pcVar6;
  pcVar1 = pNtk->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p->pSpec = pcVar6;
  Gia_ManHashAlloc(p);
  pVVar7 = pNtk->vPis;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      plVar2 = (long *)pVVar7->pArray[lVar10];
      pGVar8 = Gia_ManAppendObj(p);
      uVar3 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p->nObjs <= pGVar8)) {
LAB_001d0d2c:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p->pObjs;
      if ((pGVar8 < pGVar4) || (pGVar4 + p->nObjs <= pGVar8)) goto LAB_001d0d2c;
      *(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8) +
              0x40) = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
      lVar10 = lVar10 + 1;
      pVVar7 = pNtk->vPis;
    } while (lVar10 < pVVar7->nSize);
  }
  Abc_NtkDeriveFlatGia_rec(p,pNtk);
  pVVar7 = pNtk->vPos;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      Gia_ManAppendCo(p,*(int *)(*(long *)(*(long *)(*(long *)(*pVVar7->pArray[lVar10] + 0x20) + 8)
                                          + (long)**(int **)((long)pVVar7->pArray[lVar10] + 0x20) *
                                            8) + 0x40));
      lVar10 = lVar10 + 1;
      pVVar7 = pNtk->vPos;
    } while (lVar10 < pVVar7->nSize);
  }
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,0);
  pGVar9 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar9;
}

Assistant:

Gia_Man_t * Abc_NtkDeriveFlatGia( Abc_Ntk_t * pNtk )
{
    Gia_Man_t * pTemp, * pGia = NULL;
    Abc_Obj_t * pTerm;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( !Abc_NtkLatchNum(pNtk) );
    Abc_NtkFillTemp( pNtk );
    // start the network
    pGia = Gia_ManStart( (1<<16) );
    pGia->pName = Abc_UtilStrsav( Abc_NtkName(pNtk) );
    pGia->pSpec = Abc_UtilStrsav( Abc_NtkSpec(pNtk) );
    Gia_ManHashAlloc( pGia );
    // create PIs
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_ObjFanout0(pTerm)->iTemp = Gia_ManAppendCi( pGia );
    // recursively flatten hierarchy
    Abc_NtkDeriveFlatGia_rec( pGia, pNtk );
    // create POs
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Gia_ManAppendCo( pGia, Abc_ObjFanin0(pTerm)->iTemp );
    // prepare return value
    Gia_ManHashStop( pGia );
    Gia_ManSetRegNum( pGia, 0 );
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return pGia;
}